

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_t.cpp
# Opt level: O1

int __thiscall deci::ast_number_t::Generate(ast_number_t *this,ostream *output,int pc)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(output,"push ",5);
  poVar1 = std::ostream::_M_insert<double>(this->value);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return pc + 1;
}

Assistant:

int ast_number_t::Generate(std::ostream& output, int pc) const {
    output << "push " << this->value << std::endl;
    return pc + 1;
  }